

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhAllocateSpace(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft)

{
  short sVar1;
  sxu16 sVar2;
  int iVar3;
  ushort *puVar4;
  long lVar5;
  ushort uVar6;
  uint uVar7;
  uint *puVar8;
  ulong uVar9;
  lhcell *plVar10;
  uchar *puVar11;
  unqlite_page *puVar12;
  ushort *puVar13;
  uint *pDest;
  uint uVar14;
  ushort local_40;
  lhash_kv_engine *local_38;
  
  iVar3 = -0x49;
  if (nAmount <= pPage->nFree) {
    local_38 = pPage->pHash;
    uVar14 = (uint)nAmount;
    if (pPage->nCell < 10) {
      iVar3 = local_38->iPageSize;
      if (iVar3 / 2 <= (int)uVar14) {
        return -0x49;
      }
    }
    else {
      iVar3 = local_38->iPageSize;
    }
    puVar12 = pPage->pRaw;
    local_40 = (pPage->sHdr).iFree;
    puVar4 = (ushort *)0x0;
    do {
      if ((long)iVar3 <= (long)(ulong)local_40) {
        return -0x49;
      }
      puVar13 = (ushort *)(puVar12->zData + local_40);
      local_40 = *puVar13 << 8 | *puVar13 >> 8;
      uVar6 = puVar13[1] << 8 | puVar13[1] >> 8;
      if ((ushort)nAmount <= uVar6) goto LAB_00113f1d;
      puVar4 = puVar13;
    } while (local_40 != 0);
    puVar4 = (ushort *)(*local_38->pIo->xTmpPage)(local_38->pIo->pHandle);
    uVar9 = (pPage->sHdr).iSlave;
    plVar10 = pPage->pMaster->pList;
    *(ulong *)(puVar4 + 2) =
         uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
    pDest = (uint *)(puVar4 + 6);
    puVar8 = (uint *)((long)local_38->iPageSize + (long)puVar4);
    (pPage->sHdr).iOfft = 0;
    for (; plVar10 != (lhcell *)0x0; plVar10 = plVar10->pNext) {
      puVar12 = plVar10->pPage->pRaw;
      if (puVar12->iPage == pPage->pRaw->iPage) {
        if (plVar10->iOvfl == 0) {
          puVar11 = puVar12->zData + (ulong)plVar10->iStart + 0x1a;
        }
        else {
          puVar11 = (uchar *)0x0;
        }
        plVar10->iNext = (pPage->sHdr).iOfft;
        sVar2 = (short)pDest - (short)puVar4;
        plVar10->iStart = sVar2;
        (pPage->sHdr).iOfft = sVar2;
        uVar7 = plVar10->nHash;
        *pDest = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        uVar7 = plVar10->nKey;
        pDest[1] = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        uVar9 = plVar10->nData;
        *(ulong *)(pDest + 2) =
             uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
             (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
             (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
        *(sxu16 *)(pDest + 4) = plVar10->iNext << 8 | plVar10->iNext >> 8;
        uVar9 = plVar10->iOvfl;
        *(ulong *)((long)pDest + 0x12) =
             uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
             (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
             (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
        pDest = (uint *)((long)pDest + 0x1a);
        if (puVar11 != (uchar *)0x0) {
          SyMemcpy(puVar11,pDest,plVar10->nKey + (int)plVar10->nData);
          pDest = (uint *)((long)pDest + (ulong)plVar10->nKey + plVar10->nData);
        }
        if (puVar8 <= pDest) break;
      }
    }
    uVar9 = (long)puVar8 - (long)pDest;
    pPage->nFree = (sxu16)uVar9;
    if ((uVar9 & 0xfffc) == 0) {
      pPage->nFree = 0;
      (pPage->sHdr).iFree = 0;
    }
    else {
      (pPage->sHdr).iFree = (short)pDest - (short)puVar4;
      *(ushort *)pDest = 0;
      *(sxu16 *)((long)pDest + 2) = pPage->nFree << 8 | pPage->nFree >> 8;
    }
    uVar6 = (pPage->sHdr).iOfft;
    *puVar4 = uVar6 << 8 | uVar6 >> 8;
    uVar6 = (pPage->sHdr).iFree;
    puVar4[1] = uVar6 << 8 | uVar6 >> 8;
    SyMemcpy(puVar4,pPage->pRaw->zData,local_38->iPageSize);
    uVar6 = pPage->nFree;
    iVar3 = -0x49;
    if (uVar14 <= uVar6) {
      local_38 = pPage->pHash;
      puVar12 = pPage->pRaw;
      puVar13 = (ushort *)(puVar12->zData + (pPage->sHdr).iFree);
      local_40 = 0;
      puVar4 = (ushort *)0x0;
LAB_00113f1d:
      uVar7 = (uint)uVar6;
      iVar3 = (*local_38->pIo->xWrite)(puVar12);
      if (iVar3 == 0) {
        puVar11 = pPage->pRaw->zData;
        sVar1 = (short)puVar11;
        uVar6 = (short)puVar13 - sVar1;
        *pOfft = uVar6;
        if ((int)(uVar7 - uVar14) < 4 || uVar7 < uVar14) {
          nAmount = (sxu64)uVar7;
        }
        else {
          lVar5 = (nAmount & 0xffffffff) + (ulong)uVar6;
          puVar11[lVar5 + 1] = (uchar)local_40;
          puVar11[lVar5] = (uchar)(local_40 >> 8);
          puVar11[lVar5 + 3] = (uchar)(uVar7 - uVar14);
          puVar11[lVar5 + 2] = (uchar)(uVar7 - uVar14 >> 8);
          puVar11 = pPage->pRaw->zData;
          local_40 = (sVar1 + (short)lVar5) - (short)puVar11;
        }
        if (puVar4 == (ushort *)0x0) {
          (pPage->sHdr).iFree = local_40;
          puVar11[3] = (uchar)local_40;
          puVar4 = (ushort *)(puVar11 + 2);
        }
        else {
          *(uchar *)((long)puVar4 + 1) = (uchar)local_40;
        }
        *(char *)puVar4 = (char)(local_40 >> 8);
        pPage->nFree = pPage->nFree - (short)nAmount;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int lhAllocateSpace(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft)
{
	const unsigned char *zEnd,*zPtr;
	sxu16 iNext,iBlksz,nByte;
	unsigned char *zPrev;
	int rc;
	if( (sxu64)pPage->nFree < nAmount ){
		/* Don't bother looking for a free chunk */
		return UNQLITE_FULL;
	}
	if( pPage->nCell < 10 && ((int)nAmount >= (pPage->pHash->iPageSize / 2)) ){
		/* Big chunk need an overflow page for its data */
		return UNQLITE_FULL;
	}
	zPtr = &pPage->pRaw->zData[pPage->sHdr.iFree];
	zEnd = &pPage->pRaw->zData[pPage->pHash->iPageSize];
	nByte = (sxu16)nAmount;
	zPrev = 0;
	iBlksz = 0; /* cc warning */
	/* Perform the lookup */
	for(;;){
		if( zPtr >= zEnd ){
			return UNQLITE_FULL;
		}
		/* Offset of the next free block */
		SyBigEndianUnpack16(zPtr,&iNext);
		/* Block size */
		SyBigEndianUnpack16(&zPtr[2],&iBlksz);
		if( iBlksz >= nByte ){
			/* Got one */
			break;
		}
		zPrev = (unsigned char *)zPtr;
		if( iNext == 0 ){
			/* No more free blocks, defragment the page */
			rc = lhPageDefragment(pPage);
			if( rc == UNQLITE_OK && pPage->nFree >= nByte) {
				/* Free blocks are merged together */
				iNext = 0;
				zPtr = &pPage->pRaw->zData[pPage->sHdr.iFree];
				iBlksz = pPage->nFree;
				zPrev = 0;
				break;
			}else{
				return UNQLITE_FULL;
			}
		}
		/* Point to the next free block */
		zPtr = &pPage->pRaw->zData[iNext];
	}
	/* Acquire writer lock on this page */
	rc = pPage->pHash->pIo->xWrite(pPage->pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Save block offset */
	*pOfft = (sxu16)(zPtr - pPage->pRaw->zData);
	/* Fix pointers */
	if( iBlksz >= nByte && (iBlksz - nByte) > 3 ){
		unsigned char *zBlock = &pPage->pRaw->zData[(*pOfft) + nByte];
		/* Create a new block */
		zPtr = zBlock;
		SyBigEndianPack16(zBlock,iNext); /* Offset of the next block */
		SyBigEndianPack16(&zBlock[2],iBlksz-nByte); /* Block size*/
		/* Offset of the new block */
		iNext = (sxu16)(zPtr - pPage->pRaw->zData);
		iBlksz = nByte;
	}
	/* Fix offsets */
	if( zPrev ){
		SyBigEndianPack16(zPrev,iNext);
	}else{
		/* First block */
		pPage->sHdr.iFree = iNext;
		/* Reflect on the page header */
		SyBigEndianPack16(&pPage->pRaw->zData[2/* Offset of the first cell1*/],iNext);
	}
	/* All done */
	pPage->nFree -= iBlksz;
	return UNQLITE_OK;
}